

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O1

BOOL Js::JavascriptConversion::ToInt32Finite(Var aValue,ScriptContext *scriptContext,int32 *result)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  JavascriptBoolean *pJVar8;
  JavascriptString *this;
  JavascriptTypedNumber<long> *pJVar9;
  JavascriptTypedNumber<unsigned_long> *pJVar10;
  Type TVar11;
  ulong uVar12;
  double value;
  undefined1 auVar13 [16];
  ScriptContext *local_58;
  
  bVar2 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar2) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    local_58 = (((((pRVar6->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
  }
  else {
    local_58 = (ScriptContext *)0x0;
  }
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  bVar2 = true;
LAB_00a9ad2a:
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a9b1e1;
    *puVar7 = 0;
  }
  uVar12 = (ulong)aValue & 0xffff000000000000;
  bVar3 = ((ulong)aValue & 0x1ffff00000000) != 0x1000000000000;
  if (bVar3 && uVar12 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00a9b1e1;
    *puVar7 = 0;
  }
  TVar11 = TypeIds_FirstNumberType;
  if ((uVar12 != 0x1000000000000) && (TVar11 = TypeIds_Number, aValue < (Var)0x4000000000000)) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00a9b1e1;
      *puVar7 = 0;
    }
    TVar11 = ((pRVar6->type).ptr)->typeId;
    if ((0x57 < (int)TVar11) && (BVar5 = RecyclableObject::IsExternal(pRVar6), BVar5 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) goto LAB_00a9b1e1;
      *puVar7 = 0;
    }
  }
  switch(TVar11) {
  case TypeIds_Undefined:
    goto switchD_00a9af83_caseD_0;
  case TypeIds_Null:
    *result = 0;
    return 1;
  case TypeIds_Boolean:
    pJVar8 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
    *result = (uint)(pJVar8->value != 0);
    return 1;
  case TypeIds_FirstNumberType:
    if (bVar3 && uVar12 == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00a9b1e1;
      *puVar7 = 0;
    }
    if (uVar12 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar2) goto LAB_00a9b1e1;
      *puVar7 = 0;
    }
    *result = (int32)aValue;
    return 1;
  case TypeIds_Number:
    if (aValue < (Var)0x4000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00a9b1e1;
      *puVar7 = 0;
    }
    value = (double)((ulong)aValue ^ 0xfffc000000000000);
    break;
  case TypeIds_Int64Number:
    pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
    value = (double)pJVar9->m_value;
    break;
  case TypeIds_LastNumberType:
    pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    auVar13._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar10->m_value);
    auVar13._8_4_ = (int)(pJVar10->m_value >> 0x20);
    auVar13._12_4_ = 0x45300000;
    value = (auVar13._0_8_ - 4503599627370496.0) + (auVar13._8_8_ - 1.9342813113834067e+25);
    break;
  case TypeIds_String:
    this = UnsafeVarTo<Js::JavascriptString>(aValue);
    value = JavascriptString::ToDouble(this);
    break;
  case TypeIds_Symbol:
    JavascriptError::TryThrowTypeError(local_58,scriptContext,-0x7ff5ec77,(PCWSTR)0x0);
switchD_00a9af83_caseD_0:
    *result = 0;
    return 0;
  default:
    BVar5 = JavascriptOperators::IsObject(aValue);
    if (BVar5 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x45d,"(JavascriptOperators::IsObject(aValue))",
                                  "bad type object in conversion ToInteger32");
      if (!bVar3) goto LAB_00a9b1e1;
      *puVar7 = 0;
    }
    if (bVar2) goto code_r0x00a9af5b;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x460,"(0)",
                                "wrong call in ToInteger32_Full, no dynamic objects should get here"
                               );
    if (bVar2) {
      *puVar7 = 0;
      JavascriptError::ThrowError(scriptContext,-0x7ff5fe4a,(PCWSTR)0x0);
    }
LAB_00a9b1e1:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  BVar5 = ToInt32Finite(value,result);
  return BVar5;
code_r0x00a9af5b:
  aValue = ToPrimitive<(Js::JavascriptHint)2>(aValue,scriptContext);
  bVar2 = false;
  goto LAB_00a9ad2a;
}

Assistant:

BOOL JavascriptConversion::ToInt32Finite(Var aValue, ScriptContext* scriptContext, int32* result)
    {
        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        BOOL fPrimitiveOnly = false;
        while(true)
        {
            switch (JavascriptOperators::GetTypeId(aValue))
            {
            case TypeIds_Symbol:
                JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
                // Fallthrough to return false and set result to 0 if exceptions are disabled
            case TypeIds_Undefined:
                *result = 0;
                return false;

            case TypeIds_Null:
                *result = 0;
                return true;

            case TypeIds_Integer:
                *result = TaggedInt::ToInt32(aValue);
                return true;

            case TypeIds_Boolean:
                *result = UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;
                return true;

            case TypeIds_Number:
                return ToInt32Finite(JavascriptNumber::GetValue(aValue), result);

            case TypeIds_Int64Number:
                // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
                // treat it as double anyhow.
                return ToInt32Finite((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue(), result);

            case TypeIds_UInt64Number:
                // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
                // treat it as double anyhow.
                return ToInt32Finite((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue(), result);

            case TypeIds_String:
                return ToInt32Finite(UnsafeVarTo<JavascriptString>(aValue)->ToDouble(), result);

            default:
                {
                    AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger32");
                    if(fPrimitiveOnly)
                    {
                        AssertMsg(FALSE, "wrong call in ToInteger32_Full, no dynamic objects should get here");
                        JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
                    }
                    fPrimitiveOnly = true;
                    aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
                }
            }
        }
    }